

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>_>_>
::~PredicateFormatterFromMatcher
          (PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>_>_>
           *this)

{
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>_>_>
  *this_local;
  
  ElementsAreMatcher<std::tuple<prometheus::ClientMetric::Label,_prometheus::ClientMetric::Label>_>
  ::~ElementsAreMatcher(&this->matcher_);
  return;
}

Assistant:

explicit PredicateFormatterFromMatcher(M m) : matcher_(std::move(m)) {}